

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

Status __thiscall
leveldb::SpecialEnv::NewWritableFile(std::__cxx11::string_const&,leveldb::WritableFile**)::
ManifestFile::Append(leveldb::Slice_const__(void *this,Slice *data)

{
  Slice local_28;
  Slice local_18;
  
  if ((*(byte *)(data->size_ + 0x15) & 1) == 0) {
    (**(code **)(*(long *)data[1].data_ + 0x10))(this);
  }
  else {
    local_18.data_ = "simulated writer error";
    local_18.size_ = 0x16;
    local_28.data_ = "";
    local_28.size_ = 0;
    Status::IOError((Status *)this,&local_18,&local_28);
  }
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& data) {
        if (env_->manifest_write_error_.load(std::memory_order_acquire)) {
          return Status::IOError("simulated writer error");
        } else {
          return base_->Append(data);
        }
      }